

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ym2612_set_mute_mask(void *chip,UINT32 MuteMask)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)chip + 0x4908;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    *(bool *)lVar1 = (MuteMask >> ((uint)lVar2 & 0x1f) & 1) != 0;
    lVar1 = lVar1 + 0x198;
  }
  *(byte *)((long)chip + 0x5110) = (byte)(MuteMask >> 6) & 1;
  return;
}

Assistant:

void ym2612_set_mute_mask(void *chip, UINT32 MuteMask)
{
	YM2612 *F2612 = (YM2612 *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 6; CurChn ++)
		F2612->CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	F2612->MuteDAC = (MuteMask >> 6) & 0x01;
	
	return;
}